

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

bool __thiscall ghc::filesystem::path::has_relative_path(path *this)

{
  ulong uVar1;
  size_type sVar2;
  size_type sVar3;
  ulong uVar4;
  
  sVar2 = root_name_length(this);
  sVar3 = root_name_length(this);
  uVar1 = (this->_path)._M_string_length;
  if (sVar3 < uVar1) {
    uVar4 = (ulong)((this->_path)._M_dataplus._M_p[sVar3] == '/');
  }
  else {
    uVar4 = 0;
  }
  return uVar4 + sVar2 < uVar1;
}

Assistant:

GHC_INLINE bool path::has_relative_path() const
{
    auto rootPathLen = _prefixLength + root_name_length() + (has_root_directory() ? 1 : 0);
    return rootPathLen < _path.length();
}